

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiQuery.cpp
# Opt level: O2

void __thiscall
MultiQuery<dto::Simple,_dto::Complex>::on_output
          (MultiQuery<dto::Simple,_dto::Complex> *this,Poll *p)

{
  size_type sVar1;
  ostream *poVar2;
  Error *this_00;
  shared_ptr<Alarm> local_60;
  string data;
  
  dto::marshall<dto::Simple>(&data,&this->req);
  sVar1 = sendto((this->super_Subscriber).fd,data._M_dataplus._M_p,data._M_string_length,0,
                 (sockaddr *)&this->remote,0x10);
  if (sVar1 == data._M_string_length) {
    poVar2 = std::operator<<((ostream *)&std::cout,"MultiQuery: sent ");
    poVar2 = operator<<(poVar2,&this->req);
    std::endl<char,std::char_traits<char>>(poVar2);
    Subscriber::set_expected(&this->super_Subscriber,1);
    Poll::notify_subscriber_changed(p,&this->super_Subscriber);
    if (this->timeout < 1) {
      Poll::unsubscribe(p,&this->super_Subscriber);
    }
    else {
      std::
      make_shared<Alarm,int&,MultiQuery<dto::Simple,dto::Complex>::on_output(Poll&)::_lambda()_1_>
                ((int *)&local_60,(anon_class_16_2_fd512ddd *)&this->timeout);
      Poll::subscribe_alarm(p,&local_60);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_60.super___shared_ptr<Alarm,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    }
    std::__cxx11::string::~string((string *)&data);
    return;
  }
  this_00 = (Error *)__cxa_allocate_exception(0x3f0);
  Error::Error(this_00,"Could not write");
  __cxa_throw(this_00,&Error::typeinfo,std::exception::~exception);
}

Assistant:

void MultiQuery<REQ, RES>::on_output(Poll &p) {
  auto data = dto::marshall(this->req);
  if (sendto(fd, &data[0], data.size(), 0, (struct sockaddr *) &remote, sizeof(remote)) != data.size()) {
    throw Error("Could not write");
  }
  std::cout << "MultiQuery: sent " << this->req << std::endl;
  set_expected(POLLIN);
  p.notify_subscriber_changed(*this);
  if (this->timeout > 0) {
    p.subscribe_alarm(std::make_shared<Alarm>(this->timeout, [&] {
      if (this->done)
        this->done();
      p.unsubscribe(*this);
    }));
  } else {
    p.unsubscribe(*this);
  }
}